

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O3

void updateMode(args *t,stateRecord *state)

{
  node *pnVar1;
  Mode MVar2;
  
  MVar2 = CLEANUP;
  if (state->type != SIMPLE) {
    pnVar1 = (state->targetEdge).child;
    MVar2 = DISCOVERY;
    if ((((pnVar1->readyToReplace)._M_base._M_i & 1U) != 0) &&
       (MVar2 = CLEANUP, -1 < (int)(pnVar1->markedKey).super___atomic_base<unsigned_long>._M_i)) {
      __assert_fail("KeyMarked(node->markedKey)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jaykhandare[P]A-fast-Lock-Free-Internal-Binary-Search-Tree/other_functions.h"
                    ,0x248,"void updateMode(struct args *, struct stateRecord *)");
    }
  }
  state->mode = MVar2;
  return;
}

Assistant:

void updateMode(struct args* t,struct stateRecord* state)
{
    struct node* node;

    node = state->targetEdge.child;

    if(state->type == SIMPLE)
    {
        state->mode = CLEANUP;
    }
    else
    {
        if(node->readyToReplace)
        {
            assert(KeyMarked(node->markedKey));
            state->mode = CLEANUP;
        }
        else
        {
            state->mode = DISCOVERY;
        }
    }
    return;
}